

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_SwapWithEmpty_Test::TestBody
          (ExtensionSetTest_SwapWithEmpty_Test *this)

{
  TestAllExtensions message1;
  TestAllExtensions message2;
  TestAllExtensions TStack_68;
  TestAllExtensions local_38;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&TStack_68,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_38,(Arena *)0x0);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&TStack_68);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>(&TStack_68);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>(&local_38);
  if ((TStack_68.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    TStack_68.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(ulong *)(TStack_68.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                   0xfffffffffffffffe);
  }
  if ((local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(ulong *)(local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                   0xfffffffffffffffe);
  }
  if (TStack_68.super_Message.super_MessageLite._internal_metadata_.ptr_ ==
      local_38.super_Message.super_MessageLite._internal_metadata_.ptr_) {
    proto2_unittest::TestAllExtensions::InternalSwap(&TStack_68,&local_38);
  }
  else {
    GenericSwap(&TStack_68.super_Message,&local_38.super_Message);
  }
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>(&local_38);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>(&TStack_68);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_38);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&TStack_68);
  return;
}

Assistant:

TEST(ExtensionSetTest, SwapWithEmpty) {
  unittest::TestAllExtensions message1, message2;
  TestUtil::SetAllExtensions(&message1);

  TestUtil::ExpectAllExtensionsSet(message1);
  TestUtil::ExpectExtensionsClear(message2);
  message1.Swap(&message2);
  TestUtil::ExpectAllExtensionsSet(message2);
  TestUtil::ExpectExtensionsClear(message1);
}